

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_async_generator_free(JSRuntime *rt,JSAsyncGeneratorData *s)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  JSValueUnion JVar4;
  list_head *plVar5;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  
  plVar5 = (s->queue).next;
  if (plVar5 != &s->queue) {
    do {
      plVar2 = plVar5->next;
      plVar3 = plVar5[2].prev;
      if (0xfffffff4 < (uint)plVar3) {
        JVar4 = (JSValueUnion)plVar5[1].next;
        iVar1 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v.tag = (int64_t)plVar3;
          v.u.ptr = JVar4.ptr;
          __JS_FreeValueRT(rt,v);
        }
      }
      plVar3 = plVar5[3].prev;
      if (0xfffffff4 < (uint)plVar3) {
        JVar4 = (JSValueUnion)plVar5[2].next;
        iVar1 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v_00.tag = (int64_t)plVar3;
          v_00.u.ptr = JVar4.ptr;
          __JS_FreeValueRT(rt,v_00);
        }
      }
      plVar3 = plVar5[4].prev;
      if (0xfffffff4 < (uint)plVar3) {
        JVar4 = (JSValueUnion)plVar5[3].next;
        iVar1 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v_01.tag = (int64_t)plVar3;
          v_01.u.ptr = JVar4.ptr;
          __JS_FreeValueRT(rt,v_01);
        }
      }
      plVar3 = plVar5[5].prev;
      if (0xfffffff4 < (uint)plVar3) {
        JVar4 = (JSValueUnion)plVar5[4].next;
        iVar1 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v_02.tag = (int64_t)plVar3;
          v_02.u.ptr = JVar4.ptr;
          __JS_FreeValueRT(rt,v_02);
        }
      }
      (*(rt->mf).js_free)(&rt->malloc_state,plVar5);
      plVar5 = plVar2;
    } while (plVar2 != &s->queue);
  }
  if ((s->state & ~JS_ASYNC_GENERATOR_STATE_SUSPENDED_YIELD) !=
      JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
    async_func_free(rt,&s->func_state);
  }
  (*(rt->mf).js_free)(&rt->malloc_state,s);
  return;
}

Assistant:

static void js_async_generator_free(JSRuntime *rt,
                                    JSAsyncGeneratorData *s)
{
    struct list_head *el, *el1;
    JSAsyncGeneratorRequest *req;

    list_for_each_safe(el, el1, &s->queue) {
        req = list_entry(el, JSAsyncGeneratorRequest, link);
        JS_FreeValueRT(rt, req->result);
        JS_FreeValueRT(rt, req->promise);
        JS_FreeValueRT(rt, req->resolving_funcs[0]);
        JS_FreeValueRT(rt, req->resolving_funcs[1]);
        js_free_rt(rt, req);
    }
    if (s->state != JS_ASYNC_GENERATOR_STATE_COMPLETED &&
        s->state != JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
        async_func_free(rt, &s->func_state);
    }
    js_free_rt(rt, s);
}